

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O1

void Omega_h::deal_with_tests_failed
               (int *num_originators_failed,int *first_originator_failed,int zeta_prime_addr,
               bool *tests_failed,vector<int,_std::allocator<int>_> *lane,
               vector<bool,_std::allocator<bool>_> *in_lane,int zeta_addr,
               vector<int,_std::allocator<int>_> *stack,bool verbose)

{
  ulong *puVar1;
  iterator iVar2;
  pointer piVar3;
  ostream *poVar4;
  int iVar5;
  undefined8 uVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  int local_3c;
  int local_38;
  int local_34;
  
  local_3c = zeta_prime_addr;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"  Dealing with test failures\n",0x1d);
  }
  if (*num_originators_failed == 1) {
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    ",4);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_3c);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," is the second originator of ",0x1d);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,zeta_addr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," to fail the tests\n",0x13);
      local_34 = *first_originator_failed;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"    the first was ",0x12);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_34);
      local_38 = CONCAT31(local_38._1_3_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_38,1);
    }
    else {
      local_34 = *first_originator_failed;
    }
    piVar3 = (lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    uVar8 = (long)(lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar3;
    iVar5 = (int)(uVar8 >> 2);
    if (0 < iVar5) {
      if (piVar3[iVar5 - 1] != local_34) {
        pcVar9 = "at(lane, size(lane) - 1) == zeta_double_prime_addr";
        pcVar7 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_build_parser.cpp"
        ;
        uVar6 = 0x2c6;
        goto LAB_00241d35;
      }
      if (iVar5 != 1) {
        if (piVar3[iVar5 - 2] != zeta_addr) {
          pcVar9 = "at(lane, size(lane) - 2) == zeta_addr";
          pcVar7 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_build_parser.cpp"
          ;
          uVar6 = 0x2c7;
          goto LAB_00241d35;
        }
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"    pop LANE, push {marker, ",0x1c);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_34);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} onto it:\n    ",0xf);
          std::vector<int,_std::allocator<int>_>::resize
                    (lane,((long)(lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)(lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start >> 2) - 1);
          local_38 = -0x1b1;
          iVar2._M_current =
               (lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_finish;
          if (iVar2._M_current ==
              (lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(lane,iVar2,&local_38);
          }
          else {
            *iVar2._M_current = -0x1b1;
            (lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar2._M_current + 1;
          }
          iVar2._M_current =
               (lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_finish;
          if (iVar2._M_current ==
              (lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)lane,iVar2,&local_34);
          }
          else {
            *iVar2._M_current = local_34;
            (lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar2._M_current + 1;
          }
          print_stack(lane);
        }
        else {
          std::vector<int,_std::allocator<int>_>::resize(lane,((long)uVar8 >> 2) - 1);
          local_38 = -0x1b1;
          iVar2._M_current =
               (lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_finish;
          if (iVar2._M_current ==
              (lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(lane,iVar2,&local_38);
          }
          else {
            *iVar2._M_current = -0x1b1;
            (lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar2._M_current + 1;
          }
          iVar2._M_current =
               (lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_finish;
          if (iVar2._M_current ==
              (lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)lane,iVar2,&local_34);
          }
          else {
            *iVar2._M_current = local_34;
            (lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar2._M_current + 1;
          }
        }
        if (!verbose) {
          local_38 = -0x1b1;
          iVar2._M_current =
               (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(stack,iVar2,&local_38);
          }
          else {
            *iVar2._M_current = -0x1b1;
            (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar2._M_current + 1;
          }
          goto LAB_00241caa;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"    push {marker, ",0x12);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_3c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} onto STACK:\n    ",0x12);
        local_38 = -0x1b1;
        iVar2._M_current =
             (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar2._M_current ==
            (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(stack,iVar2,&local_38);
        }
        else {
          *iVar2._M_current = -0x1b1;
          (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar2._M_current + 1;
        }
        goto LAB_00241c6c;
      }
    }
    goto LAB_00241ce3;
  }
  if (*num_originators_failed != 0) {
    if (!verbose) {
LAB_00241caa:
      iVar2._M_current =
           (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar2._M_current ==
          (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)stack,iVar2,&local_3c);
      }
      else {
        *iVar2._M_current = local_3c;
        (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      goto LAB_00241cd1;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    ",4);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_3c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," is the third or later originator of ",0x25);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,zeta_addr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," to fail the tests\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    pushing ",0xc);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_3c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," onto STACK:\n    ",0x11);
LAB_00241c6c:
    iVar2._M_current =
         (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar2._M_current ==
        (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)stack,iVar2,&local_3c);
    }
    else {
      *iVar2._M_current = local_3c;
      (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar2._M_current + 1;
    }
    print_stack(stack);
    goto LAB_00241cd1;
  }
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    ",4);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_3c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," is the first originator of ",0x1c);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,zeta_addr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," to fail the tests\n",0x13);
    *first_originator_failed = local_3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    pushing ",0xc);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_3c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," onto LANE:\n    ",0x10);
  }
  else {
    *first_originator_failed = local_3c;
  }
  iVar2._M_current =
       (lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)lane,iVar2,&local_3c);
  }
  else {
    *iVar2._M_current = local_3c;
    (lane->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = iVar2._M_current + 1;
  }
  if (verbose) {
    print_stack(lane);
    if ((long)local_3c < 0) {
LAB_00241ce3:
      pcVar9 = "0 <= i";
      pcVar7 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
      ;
      uVar6 = 0x13;
LAB_00241d35:
      fail("assertion %s failed at %s +%d\n",pcVar9,pcVar7,uVar6);
    }
    puVar1 = (in_lane->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p + ((ulong)(long)local_3c >> 6);
    *puVar1 = *puVar1 | 1L << ((byte)local_3c & 0x3f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    IN_LANE(",0xc);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_3c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") <- ON\n",8);
  }
  else {
    if ((long)local_3c < 0) goto LAB_00241ce3;
    puVar1 = (in_lane->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p + ((ulong)(long)local_3c >> 6);
    *puVar1 = *puVar1 | 1L << ((byte)local_3c & 0x3f);
  }
  *tests_failed = true;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"    TESTS_FAILED <- ON\n",0x17);
  }
LAB_00241cd1:
  *num_originators_failed = *num_originators_failed + 1;
  return;
}

Assistant:

static void deal_with_tests_failed(int& num_originators_failed,
    int& first_originator_failed, int zeta_prime_addr, bool& tests_failed,
    std::vector<int>& lane, std::vector<bool>& in_lane, int zeta_addr,
    std::vector<int>& stack, bool verbose) {
  if (verbose) std::cerr << "  Dealing with test failures\n";
  if (num_originators_failed == 0) {
    if (verbose)
      std::cerr << "    " << zeta_prime_addr << " is the first originator of "
                << zeta_addr << " to fail the tests\n";
    first_originator_failed = zeta_prime_addr;
    if (verbose)
      std::cerr << "    pushing " << zeta_prime_addr << " onto LANE:\n    ";
    lane.push_back(zeta_prime_addr);
    if (verbose) print_stack(lane);
    at(in_lane, zeta_prime_addr) = true;
    if (verbose) std::cerr << "    IN_LANE(" << zeta_prime_addr << ") <- ON\n";
    tests_failed = true;
    if (verbose) std::cerr << "    TESTS_FAILED <- ON\n";
  } else if (num_originators_failed == 1) {
    if (verbose)
      std::cerr << "    " << zeta_prime_addr << " is the second originator of "
                << zeta_addr << " to fail the tests\n";
    auto zeta_double_prime_addr = first_originator_failed;
    if (verbose)
      std::cerr << "    the first was " << zeta_double_prime_addr << '\n';
    OMEGA_H_CHECK(at(lane, size(lane) - 1) == zeta_double_prime_addr);
    OMEGA_H_CHECK(at(lane, size(lane) - 2) == zeta_addr);
    if (verbose)
      std::cerr << "    pop LANE, push {marker, " << zeta_double_prime_addr
                << "} onto it:\n    ";
    lane.resize(lane.size() - 1);
    lane.push_back(MARKER);
    lane.push_back(zeta_double_prime_addr);
    if (verbose) print_stack(lane);
    if (verbose)
      std::cerr << "    push {marker, " << zeta_prime_addr
                << "} onto STACK:\n    ";
    stack.push_back(MARKER);
    stack.push_back(zeta_prime_addr);
    if (verbose) print_stack(stack);
  } else {
    if (verbose)
      std::cerr << "    " << zeta_prime_addr
                << " is the third or later originator of " << zeta_addr
                << " to fail the tests\n";
    if (verbose)
      std::cerr << "    pushing " << zeta_prime_addr << " onto STACK:\n    ";
    stack.push_back(zeta_prime_addr);
    if (verbose) print_stack(stack);
  }
  ++num_originators_failed;
}